

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

Aig_Obj_t * Fra_ClausGetLiteral(Clu_Man_t *p,int *pVar2Id,int Lit)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int NodeId;
  Aig_Obj_t *pLiteral;
  int Lit_local;
  int *pVar2Id_local;
  Clu_Man_t *p_local;
  
  iVar1 = lit_var(Lit);
  if (-1 < pVar2Id[iVar1]) {
    pAVar2 = Aig_ManObj(p->pAig,pVar2Id[iVar1]);
    pAVar2 = (Aig_Obj_t *)(pAVar2->field_5).pData;
    iVar1 = lit_sign(Lit);
    pAVar2 = Aig_NotCond(pAVar2,iVar1);
    return pAVar2;
  }
  __assert_fail("NodeId >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                ,0x5f4,"Aig_Obj_t *Fra_ClausGetLiteral(Clu_Man_t *, int *, int)");
}

Assistant:

Aig_Obj_t * Fra_ClausGetLiteral( Clu_Man_t * p, int * pVar2Id, int Lit )
{
    Aig_Obj_t * pLiteral;
    int NodeId = pVar2Id[ lit_var(Lit) ];
    assert( NodeId >= 0 );
    pLiteral = (Aig_Obj_t *)Aig_ManObj( p->pAig, NodeId )->pData;
    return Aig_NotCond( pLiteral, lit_sign(Lit) );
}